

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

bool ghc::filesystem::create_directory(path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  path local_38;
  
  paVar1 = &local_38._path.field_2;
  local_38._path._M_string_length = 0;
  local_38._path.field_2._M_local_buf[0] = '\0';
  local_38._path._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = create_directory(p,&local_38,ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._path._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

GHC_INLINE bool create_directory(const path& p, std::error_code& ec) noexcept
{
    return create_directory(p, path(), ec);
}